

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_delta_lflevel(AV1_COMMON *cm,MACROBLOCKD *xd,int lf_id,int delta_lflevel,
                        int delta_lf_multi,aom_writer *w)

{
  ushort uVar1;
  qm_val_t *pqVar2;
  uint uVar3;
  short sVar4;
  ushort uVar5;
  byte bVar6;
  undefined4 in_register_00000084;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint16_t *puVar11;
  int iVar12;
  uint16_t *puVar13;
  ulong uVar14;
  
  lVar7 = CONCAT44(in_register_00000084,delta_lf_multi);
  uVar9 = (ulong)(uint)-lf_id;
  if (0 < lf_id) {
    uVar9 = (ulong)(uint)lf_id;
  }
  pqVar2 = (cm->quant_params).gqmatrix[5][2][3];
  uVar8 = (uint)uVar9;
  uVar14 = 3;
  if (uVar8 < 3) {
    uVar14 = uVar9;
  }
  if (delta_lflevel == 0) {
    puVar13 = (uint16_t *)(pqVar2 + 0x3b38);
    od_ec_encode_cdf_q15((od_ec_enc *)(lVar7 + 0x10),(int)uVar14,puVar13,4);
    if (*(char *)(lVar7 + 0x30) == '\0') goto LAB_0019f2e8;
    uVar5 = *(ushort *)(pqVar2 + 0x3b40);
    puVar11 = (uint16_t *)(pqVar2 + 0x3b40);
    bVar6 = (char)(uVar5 >> 4) + 5;
    uVar9 = 0;
    do {
      uVar1 = puVar13[uVar9];
      if (uVar9 < uVar14) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar1) >> (bVar6 & 0x1f));
      }
      else {
        sVar4 = -(uVar1 >> (bVar6 & 0x1f));
      }
      puVar13[uVar9] = sVar4 + uVar1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  else {
    puVar13 = (uint16_t *)(pqVar2 + (long)(int)xd * 10 + 0x3b10);
    od_ec_encode_cdf_q15((od_ec_enc *)(lVar7 + 0x10),(int)uVar14,puVar13,4);
    if (*(char *)(lVar7 + 0x30) == '\0') goto LAB_0019f2e8;
    puVar11 = puVar13 + 4;
    uVar5 = puVar13[4];
    bVar6 = (char)(uVar5 >> 4) + 5;
    uVar9 = 0;
    do {
      uVar1 = puVar13[uVar9];
      if (uVar9 < uVar14) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar1) >> (bVar6 & 0x1f));
      }
      else {
        sVar4 = -(uVar1 >> (bVar6 & 0x1f));
      }
      puVar13[uVar9] = sVar4 + uVar1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  *puVar11 = *puVar11 + (ushort)(uVar5 < 0x20);
LAB_0019f2e8:
  if (2 < uVar8) {
    uVar3 = 0x1f;
    if (uVar8 - 1 != 0) {
      for (; uVar8 - 1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar10 = 4;
    do {
      od_ec_encode_bool_q15
                ((od_ec_enc *)(lVar7 + 0x10),
                 (uint)((0x1e - (uVar3 ^ 0x1f) >> (uVar10 - 2 & 0x1f) & 1) != 0),0x4000);
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
    if ((uVar3 ^ 0x1f) != 0x1f) {
      iVar12 = uVar3 + 1;
      do {
        od_ec_encode_bool_q15
                  ((od_ec_enc *)(lVar7 + 0x10),
                   (uint)((uVar8 + ~(1 << ((byte)uVar3 & 0x1f)) >> (iVar12 - 2U & 0x1f) & 1) != 0),
                   0x4000);
        iVar12 = iVar12 + -1;
      } while (1 < iVar12);
    }
  }
  if (lf_id == 0) {
    return;
  }
  od_ec_encode_bool_q15((od_ec_enc *)(lVar7 + 0x10),(uint)lf_id >> 0x1f,0x4000);
  return;
}

Assistant:

static inline void write_delta_lflevel(const AV1_COMMON *cm,
                                       const MACROBLOCKD *xd, int lf_id,
                                       int delta_lflevel, int delta_lf_multi,
                                       aom_writer *w) {
  int sign = delta_lflevel < 0;
  int abs = sign ? -delta_lflevel : delta_lflevel;
  int rem_bits, thr;
  int smallval = abs < DELTA_LF_SMALL ? 1 : 0;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  (void)cm;

  if (delta_lf_multi) {
    assert(lf_id >= 0 && lf_id < (av1_num_planes(cm) > 1 ? FRAME_LF_COUNT
                                                         : FRAME_LF_COUNT - 2));
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL),
                     ec_ctx->delta_lf_multi_cdf[lf_id], DELTA_LF_PROBS + 1);
  } else {
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL), ec_ctx->delta_lf_cdf,
                     DELTA_LF_PROBS + 1);
  }

  if (!smallval) {
    rem_bits = get_msb(abs - 1);
    thr = (1 << rem_bits) + 1;
    aom_write_literal(w, rem_bits - 1, 3);
    aom_write_literal(w, abs - thr, rem_bits);
  }
  if (abs > 0) {
    aom_write_bit(w, sign);
  }
}